

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

monster * monster_target_monster(effect_handler_context_t_conflict *context)

{
  wchar_t idx;
  bool bVar1;
  monster *pmVar2;
  
  if ((context->origin).what == SRC_MONSTER) {
    pmVar2 = cave_monster(cave,(context->origin).which.grid.x);
    if (pmVar2 == (monster *)0x0) {
      bVar1 = false;
      pmVar2 = (monster *)0x0;
    }
    else {
      idx = (pmVar2->target).midx;
      if (idx < L'\x01') {
        bVar1 = true;
      }
      else {
        pmVar2 = cave_monster(cave,idx);
        if (pmVar2 == (monster *)0x0) {
          __assert_fail("t_mon",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                        ,0x68,"struct monster *monster_target_monster(effect_handler_context_t *)");
        }
        bVar1 = false;
      }
    }
    if (!bVar1) {
      return pmVar2;
    }
  }
  return (monster *)0x0;
}

Assistant:

struct monster *monster_target_monster(effect_handler_context_t *context)
{
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		if (!mon) return NULL;
		if (mon->target.midx > 0) {
			struct monster *t_mon = cave_monster(cave, mon->target.midx);
			assert(t_mon);
			return t_mon;
		}
	}
	return NULL;
}